

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

Result * __thiscall
httplib::ClientImpl::send_with_content_provider
          (Result *__return_storage_ptr__,ClientImpl *this,string *method,string *path,
          Headers *headers,char *body,size_t content_length,ContentProvider content_provider,
          ContentProviderWithoutLength content_provider_without_length,string *content_type)

{
  _Rb_tree_header *p_Var1;
  code *pcVar2;
  _Rep_type *p_Var3;
  Error error;
  unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_> res;
  string local_2e8;
  _Any_data local_2c8;
  code *local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  ClientImpl *local_2a0;
  SSL *local_298;
  undefined1 local_290 [32];
  undefined1 local_270 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_250;
  _Alloc_hider local_220;
  _Base_ptr local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  _Alloc_hider local_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  int local_1e0;
  _Alloc_hider local_1d8;
  size_t local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  _Alloc_hider local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  undefined8 local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Rb_tree_node_base local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  _Rb_tree_color local_138 [2];
  _Base_ptr local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  undefined1 local_118 [168];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Any_data _Stack_60;
  undefined1 auStack_50 [24];
  _Alloc_hider local_38;
  
  local_290._0_8_ = local_290 + 0x10;
  local_290._8_8_ = 0;
  local_290[0x10] = '\0';
  local_270._0_8_ = &local_260;
  local_270._8_8_ = 0;
  local_260._M_local_buf[0] = '\0';
  local_250._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_250._M_impl.super__Rb_tree_header._M_header;
  local_250._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_250._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_250._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_220._M_p = (pointer)&local_210;
  local_218 = (_Base_ptr)0x0;
  local_210._M_local_buf[0] = '\0';
  local_200._M_p = (pointer)&local_1f0;
  local_1f8 = 0;
  local_1f0._M_local_buf[0] = '\0';
  local_1e0 = -1;
  local_1d8._M_p = (pointer)&local_1c8;
  local_1d0 = 0;
  local_1c8._M_local_buf[0] = '\0';
  local_1b8._M_allocated_capacity._0_4_ = 0xffffffff;
  local_1b8._8_8_ = &local_1a0;
  local_1a8._M_p = (pointer)0x0;
  local_1a0._M_local_buf[0] = '\0';
  local_190 = &local_180;
  local_188 = 0;
  local_180._M_local_buf[0] = '\0';
  local_168._M_left = &local_168;
  local_168._M_color = _S_red;
  local_168._M_parent = (_Base_ptr)0x0;
  local_148._M_allocated_capacity = 0;
  local_128._M_allocated_capacity = (size_type)local_138;
  local_138[0] = _S_red;
  local_130 = (_Base_ptr)0x0;
  local_2a0 = this;
  local_298 = (SSL *)body;
  local_250._M_impl.super__Rb_tree_header._M_header._M_right =
       local_250._M_impl.super__Rb_tree_header._M_header._M_left;
  local_168._M_right = local_168._M_left;
  local_128._8_8_ = local_128._M_allocated_capacity;
  memset(local_118,0,0xa8);
  local_70._M_allocated_capacity = 0x14;
  local_38._M_p = (pointer)0x0;
  local_70._8_8_ = 0;
  _Stack_60._M_unused._M_object = (pointer)0x0;
  _Stack_60._8_8_ = 0;
  auStack_50[0] = '\0';
  auStack_50._1_7_ = 0;
  auStack_50[8] = '\0';
  auStack_50._9_8_ = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,method);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator=(&local_250,&headers->_M_t);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_270,path);
  local_2c8._M_unused._M_object = (void *)0x0;
  local_2c8._8_8_ = (pointer)0x0;
  local_2b8 = (code *)0x0;
  local_2b0._M_allocated_capacity =
       *(undefined8 *)
        (content_provider.super__Function_base._M_functor._M_unused._M_function_pointer + 0x18);
  pcVar2 = *(code **)(content_provider.super__Function_base._M_functor._M_unused._M_function_pointer
                     + 0x10);
  if (pcVar2 != (code *)0x0) {
    local_2c8._M_unused._0_8_ =
         (undefined8)*content_provider.super__Function_base._M_functor._M_unused._M_object;
    local_2c8._8_8_ =
         *(undefined8 *)
          (content_provider.super__Function_base._M_functor._M_unused._M_function_pointer + 8);
    *(undefined8 *)
     (content_provider.super__Function_base._M_functor._M_unused._M_function_pointer + 0x10) = 0;
    *(undefined8 *)
     (content_provider.super__Function_base._M_functor._M_unused._M_function_pointer + 0x18) = 0;
    local_2b8 = pcVar2;
  }
  local_2e8._M_dataplus._M_p = (pointer)0x0;
  local_2e8._M_string_length = 0;
  local_2e8.field_2._M_allocated_capacity = 0;
  local_2e8.field_2._8_8_ =
       *(undefined8 *)(content_provider.super__Function_base._M_functor._8_8_ + 0x18);
  pcVar2 = *(code **)(content_provider.super__Function_base._M_functor._8_8_ + 0x10);
  if (pcVar2 != (code *)0x0) {
    local_2e8._M_dataplus._M_p = *(pointer *)content_provider.super__Function_base._M_functor._8_8_;
    local_2e8._M_string_length =
         *(size_type *)(content_provider.super__Function_base._M_functor._8_8_ + 8);
    *(undefined8 *)(content_provider.super__Function_base._M_functor._8_8_ + 0x10) = 0;
    *(undefined8 *)(content_provider.super__Function_base._M_functor._8_8_ + 0x18) = 0;
    local_2e8.field_2._M_allocated_capacity = (size_type)pcVar2;
  }
  send_with_content_provider
            ((ClientImpl *)&res,(Request *)local_2a0,local_290,(size_t)local_298,
             (ContentProvider *)content_length,(ContentProviderWithoutLength *)&local_2c8,&local_2e8
             ,(Error *)content_provider.super__Function_base._M_manager);
  if ((code *)local_2e8.field_2._M_allocated_capacity != (code *)0x0) {
    (*(code *)local_2e8.field_2._M_allocated_capacity)(&local_2e8,&local_2e8,3);
  }
  if (local_2b8 != (code *)0x0) {
    (*local_2b8)(&local_2c8,&local_2c8,__destroy_functor);
  }
  (__return_storage_ptr__->res_)._M_t.
  super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
  super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl =
       (Response *)
       res._M_t.super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>.
       _M_t.super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
       super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl;
  res._M_t.super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
  super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
  super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl =
       (__uniq_ptr_data<httplib::Response,_std::default_delete<httplib::Response>,_true,_true>)
       (__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)0x0;
  __return_storage_ptr__->err_ = Success;
  p_Var1 = &(__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header;
  if (local_250._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color
         = _S_red;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = (_Base_ptr)0x0;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
         = &p_Var1->_M_header;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
         = &p_Var1->_M_header;
    p_Var3 = &(__return_storage_ptr__->request_headers_)._M_t;
  }
  else {
    p_Var3 = &local_250;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color
         = local_250._M_impl.super__Rb_tree_header._M_header._M_color;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header.
    _M_parent = local_250._M_impl.super__Rb_tree_header._M_header._M_parent;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
         = local_250._M_impl.super__Rb_tree_header._M_header._M_left;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
         = local_250._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_250._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    (__return_storage_ptr__->request_headers_)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_250._M_impl.super__Rb_tree_header._M_node_count;
    local_250._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_250._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_250._M_impl.super__Rb_tree_header._M_header;
    local_250._M_impl.super__Rb_tree_header._M_header._M_right =
         local_250._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  (p_Var3->_M_impl).super__Rb_tree_header._M_node_count = 0;
  std::unique_ptr<httplib::Response,_std::default_delete<httplib::Response>_>::~unique_ptr(&res);
  Request::~Request((Request *)local_290);
  return __return_storage_ptr__;
}

Assistant:

inline Result ClientImpl::send_with_content_provider(
    const std::string &method, const std::string &path, const Headers &headers,
    const char *body, size_t content_length, ContentProvider content_provider,
    ContentProviderWithoutLength content_provider_without_length,
    const std::string &content_type) {
  Request req;
  req.method = method;
  req.headers = headers;
  req.path = path;

  auto error = Error::Success;

  auto res = send_with_content_provider(
      req, body, content_length, std::move(content_provider),
      std::move(content_provider_without_length), content_type, error);

  return Result{std::move(res), error, std::move(req.headers)};
}